

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O3

Data * Integer::plus(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *this;
  long lVar2;
  long lVar3;
  long lVar4;
  _func_int **pp_Var5;
  
  this = (Data *)operator_new(0x18);
  Data::Data(this);
  this->_vptr_Data = (_func_int **)&PTR__Integer_00109d28;
  this[1]._vptr_Data = (_func_int **)0x0;
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar4 = (long)(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppDVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar3 = 0;
    pp_Var5 = (_func_int **)0x0;
    do {
      lVar2 = __dynamic_cast(ppDVar1[lVar3],&Data::typeinfo,&typeinfo,0);
      pp_Var5 = (_func_int **)((long)pp_Var5 + *(long *)(lVar2 + 0x10));
      this[1]._vptr_Data = pp_Var5;
      lVar3 = lVar3 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar3);
  }
  return this;
}

Assistant:

Data *Integer::plus(std::vector<Data *> *dataPara) {
    auto result = new Integer(0);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value += (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}